

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

int fts3ExprLoadDoclistsCb(Fts3Expr *pExpr,int iPhrase,void *ctx)

{
  Fts3Phrase *pFVar1;
  
  pFVar1 = pExpr->pPhrase;
  *(int *)((long)ctx + 8) = *(int *)((long)ctx + 8) + 1;
  *(int *)((long)ctx + 0xc) = *(int *)((long)ctx + 0xc) + pFVar1->nToken;
  return 0;
}

Assistant:

static int fts3ExprLoadDoclistsCb(Fts3Expr *pExpr, int iPhrase, void *ctx){
  int rc = SQLITE_OK;
  Fts3Phrase *pPhrase = pExpr->pPhrase;
  LoadDoclistCtx *p = (LoadDoclistCtx *)ctx;

  UNUSED_PARAMETER(iPhrase);

  p->nPhrase++;
  p->nToken += pPhrase->nToken;

  return rc;
}